

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [12];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  char cVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar61 [16];
  undefined1 auVar63 [32];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  vfloat4 a0;
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  int iVar24;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar62 [32];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    if (0.0 <= ray->tfar) {
      aVar4 = (ray->dir).field_0.field_1;
      auVar27 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
      auVar12 = ZEXT812(0) << 0x20;
      auVar30 = ZEXT816(0) << 0x40;
      auVar69._4_12_ = auVar12;
      auVar69._0_4_ = auVar27._0_4_;
      auVar25 = vrsqrt14ss_avx512f(auVar30,auVar69);
      fVar68 = auVar25._0_4_;
      local_1218[0] = fVar68 * 1.5 - auVar27._0_4_ * 0.5 * fVar68 * fVar68 * fVar68;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar68 = (ray->dir).field_0.m128[2];
      auVar73._0_4_ = aVar4.x * local_1218[0];
      auVar73._4_4_ = aVar4.y * local_1218[0];
      auVar73._8_4_ = aVar4.z * local_1218[0];
      auVar73._12_4_ = aVar4.field_3.w * local_1218[0];
      auVar25 = vshufpd_avx(auVar73,auVar73,1);
      auVar27 = vmovshdup_avx(auVar73);
      auVar84._8_4_ = 0x80000000;
      auVar84._0_8_ = 0x8000000080000000;
      auVar84._12_4_ = 0x80000000;
      auVar81._0_4_ = auVar27._0_4_ ^ 0x80000000;
      auVar27 = vunpckhps_avx(auVar73,auVar30);
      auVar81._4_12_ = auVar12;
      auVar29 = vshufps_avx(auVar27,auVar81,0x41);
      auVar27 = vdpps_avx(auVar29,auVar29,0x7f);
      auVar80._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar80._8_8_ = auVar25._8_8_ ^ auVar84._8_8_;
      auVar26 = vinsertps_avx(auVar80,auVar73,0x2a);
      auVar25 = vdpps_avx(auVar26,auVar26,0x7f);
      uVar6 = vcmpps_avx512vl(auVar25,auVar27,1);
      auVar27 = vpmovm2d_avx512vl(uVar6);
      auVar85._0_4_ = auVar27._0_4_;
      auVar85._4_4_ = auVar85._0_4_;
      auVar85._8_4_ = auVar85._0_4_;
      auVar85._12_4_ = auVar85._0_4_;
      uVar23 = vpmovd2m_avx512vl(auVar85);
      auVar27 = vpcmpeqd_avx(auVar85,auVar85);
      auVar25._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar27._4_4_;
      auVar25._0_4_ = (uint)((byte)uVar23 & 1) * auVar27._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar27._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar27._12_4_;
      auVar27 = vblendvps_avx(auVar26,auVar29,auVar25);
      auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
      auVar65._4_12_ = auVar12;
      auVar65._0_4_ = auVar25._0_4_;
      auVar26 = vrsqrt14ss_avx512f(auVar30,auVar65);
      fVar64 = auVar26._0_4_;
      fVar64 = fVar64 * 1.5 - auVar25._0_4_ * 0.5 * fVar64 * fVar64 * fVar64;
      auVar66._0_4_ = auVar27._0_4_ * fVar64;
      auVar66._4_4_ = auVar27._4_4_ * fVar64;
      auVar66._8_4_ = auVar27._8_4_ * fVar64;
      auVar66._12_4_ = auVar27._12_4_ * fVar64;
      auVar27 = vshufps_avx(auVar66,auVar66,0xc9);
      auVar25 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar82._0_4_ = auVar25._0_4_ * auVar66._0_4_;
      auVar82._4_4_ = auVar25._4_4_ * auVar66._4_4_;
      auVar82._8_4_ = auVar25._8_4_ * auVar66._8_4_;
      auVar82._12_4_ = auVar25._12_4_ * auVar66._12_4_;
      auVar27 = vfmsub231ps_fma(auVar82,auVar73,auVar27);
      auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
      auVar27 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar86._4_12_ = auVar12;
      auVar86._0_4_ = auVar27._0_4_;
      auVar26 = vrsqrt14ss_avx512f(auVar30,auVar86);
      fVar83 = auVar26._0_4_;
      fVar64 = auVar27._0_4_ * 0.5 * fVar83 * fVar83 * fVar83;
      auVar78 = ZEXT464((uint)fVar64);
      fVar64 = fVar83 * 1.5 - fVar64;
      auVar72._0_4_ = auVar25._0_4_ * fVar64;
      auVar72._4_4_ = auVar25._4_4_ * fVar64;
      auVar72._8_4_ = auVar25._8_4_ * fVar64;
      auVar72._12_4_ = auVar25._12_4_ * fVar64;
      auVar70._0_4_ = local_1218[0] * auVar73._0_4_;
      auVar70._4_4_ = local_1218[0] * auVar73._4_4_;
      auVar70._8_4_ = local_1218[0] * auVar73._8_4_;
      auVar70._12_4_ = local_1218[0] * auVar73._12_4_;
      auVar26 = vunpcklps_avx(auVar66,auVar70);
      auVar27 = vunpckhps_avx(auVar66,auVar70);
      auVar29 = vunpcklps_avx(auVar72,auVar30);
      auVar25 = vunpckhps_avx(auVar72,auVar30);
      local_11e8 = vunpcklps_avx(auVar27,auVar25);
      local_1208 = vunpcklps_avx(auVar26,auVar29);
      local_11f8 = vunpckhps_avx(auVar26,auVar29);
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl((undefined1  [16])aVar4,auVar27);
      auVar26._8_4_ = 0x219392ef;
      auVar26._0_8_ = 0x219392ef219392ef;
      auVar26._12_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar27,auVar26,1);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      puVar20 = local_11d0;
      auVar27 = vdivps_avx(auVar67,(undefined1  [16])aVar4);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar5 = (bool)((byte)uVar23 & 1);
      auVar28._0_4_ = (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * auVar27._0_4_;
      bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar27._4_4_;
      bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar27._8_4_;
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar27._12_4_;
      auVar29._8_4_ = 0x3f7ffffa;
      auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar29._12_4_ = 0x3f7ffffa;
      auVar29 = vmulps_avx512vl(auVar28,auVar29);
      auVar30._8_4_ = 0x3f800003;
      auVar30._0_8_ = 0x3f8000033f800003;
      auVar30._12_4_ = 0x3f800003;
      auVar30 = vmulps_avx512vl(auVar28,auVar30);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      auVar87._4_4_ = uVar3;
      auVar87._0_4_ = uVar3;
      auVar87._8_4_ = uVar3;
      auVar87._12_4_ = uVar3;
      auVar87._16_4_ = uVar3;
      auVar87._20_4_ = uVar3;
      auVar87._24_4_ = uVar3;
      auVar87._28_4_ = uVar3;
      auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar33 = vbroadcastss_avx512vl(auVar29);
      auVar27 = vmovshdup_avx(auVar29);
      auVar71 = ZEXT1664(auVar27);
      auVar34 = vbroadcastsd_avx512vl(auVar27);
      auVar26 = vshufpd_avx(auVar29,auVar29,1);
      auVar38._8_4_ = 2;
      auVar38._0_8_ = 0x200000002;
      auVar38._12_4_ = 2;
      auVar38._16_4_ = 2;
      auVar38._20_4_ = 2;
      auVar38._24_4_ = 2;
      auVar38._28_4_ = 2;
      auVar35 = vpermps_avx512vl(auVar38,ZEXT1632(auVar29));
      auVar36 = vbroadcastss_avx512vl(auVar30);
      auVar37._8_4_ = 1;
      auVar37._0_8_ = 0x100000001;
      auVar37._12_4_ = 1;
      auVar37._16_4_ = 1;
      auVar37._20_4_ = 1;
      auVar37._24_4_ = 1;
      auVar37._28_4_ = 1;
      auVar37 = vpermps_avx512vl(auVar37,ZEXT1632(auVar30));
      auVar38 = vpermps_avx512vl(auVar38,ZEXT1632(auVar30));
      uVar22 = (ulong)(auVar29._0_4_ < 0.0) * 0x20;
      uVar23 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
      uVar21 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x80;
      auVar39 = vbroadcastss_avx512vl(auVar25);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
LAB_01c56066:
      if (puVar20 != &local_11d8) {
        uVar17 = puVar20[-1];
        puVar20 = puVar20 + -1;
        do {
          fVar64 = (ray->dir).field_0.m128[3];
          auVar61._4_4_ = fVar64;
          auVar61._0_4_ = fVar64;
          auVar61._8_4_ = fVar64;
          auVar61._12_4_ = fVar64;
          auVar62._16_4_ = fVar64;
          auVar62._0_16_ = auVar61;
          auVar62._20_4_ = fVar64;
          auVar62._24_4_ = fVar64;
          auVar62._28_4_ = fVar64;
          auVar27 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar61);
          auVar63._0_4_ = auVar27._0_4_;
          auVar63._4_4_ = auVar63._0_4_;
          auVar63._8_4_ = auVar63._0_4_;
          auVar63._12_4_ = auVar63._0_4_;
          auVar63._16_4_ = auVar63._0_4_;
          auVar63._20_4_ = auVar63._0_4_;
          auVar63._24_4_ = auVar63._0_4_;
          auVar63._28_4_ = auVar63._0_4_;
          do {
            if ((uVar17 & 8) != 0) {
              auVar71 = ZEXT1664(auVar71._0_16_);
              auVar78 = ZEXT1664(auVar78._0_16_);
              cVar15 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_1218,ray,context);
              if (cVar15 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_01c56066;
            }
            uVar18 = (uint)uVar17 & 7;
            uVar16 = uVar17 & 0xfffffffffffffff0;
            if (uVar18 == 3) {
              auVar42 = *(undefined1 (*) [32])(uVar16 + 0x40);
              auVar41 = *(undefined1 (*) [32])(uVar16 + 0x60);
              auVar43 = *(undefined1 (*) [32])(uVar16 + 0x80);
              auVar44 = *(undefined1 (*) [32])(uVar16 + 0xe0);
              auVar51 = *(undefined1 (*) [32])(uVar16 + 0x100);
              auVar52 = *(undefined1 (*) [32])(uVar16 + 0x120);
              auVar53 = *(undefined1 (*) [32])(uVar16 + 0x140);
              auVar79._0_4_ = fVar68 * auVar51._0_4_;
              auVar79._4_4_ = fVar68 * auVar51._4_4_;
              auVar79._8_4_ = fVar68 * auVar51._8_4_;
              auVar79._12_4_ = fVar68 * auVar51._12_4_;
              auVar79._16_4_ = fVar68 * auVar51._16_4_;
              auVar79._20_4_ = fVar68 * auVar51._20_4_;
              auVar79._28_36_ = auVar78._28_36_;
              auVar79._24_4_ = fVar68 * auVar51._24_4_;
              auVar78._0_4_ = fVar68 * auVar52._0_4_;
              auVar78._4_4_ = fVar68 * auVar52._4_4_;
              auVar78._8_4_ = fVar68 * auVar52._8_4_;
              auVar78._12_4_ = fVar68 * auVar52._12_4_;
              auVar78._16_4_ = fVar68 * auVar52._16_4_;
              auVar78._20_4_ = fVar68 * auVar52._20_4_;
              auVar78._28_36_ = auVar71._28_36_;
              auVar78._24_4_ = fVar68 * auVar52._24_4_;
              auVar45._4_4_ = fVar68 * auVar53._4_4_;
              auVar45._0_4_ = fVar68 * auVar53._0_4_;
              auVar45._8_4_ = fVar68 * auVar53._8_4_;
              auVar45._12_4_ = fVar68 * auVar53._12_4_;
              auVar45._16_4_ = fVar68 * auVar53._16_4_;
              auVar45._20_4_ = fVar68 * auVar53._20_4_;
              auVar45._24_4_ = fVar68 * auVar53._24_4_;
              auVar45._28_4_ = fVar68;
              auVar13._4_4_ = uVar2;
              auVar13._0_4_ = uVar2;
              auVar13._8_4_ = uVar2;
              auVar13._12_4_ = uVar2;
              auVar13._16_4_ = uVar2;
              auVar13._20_4_ = uVar2;
              auVar13._24_4_ = uVar2;
              auVar13._28_4_ = uVar2;
              auVar27 = vfmadd231ps_fma(auVar79._0_32_,auVar13,*(undefined1 (*) [32])(uVar16 + 0xa0)
                                       );
              auVar25 = vfmadd231ps_fma(auVar78._0_32_,auVar13,*(undefined1 (*) [32])(uVar16 + 0xc0)
                                       );
              auVar26 = vfmadd231ps_fma(auVar45,auVar13,auVar44);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar14,auVar42);
              auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar14,auVar41);
              auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar14,auVar43);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(ZEXT1632(auVar27),auVar45);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar17 = vcmpps_avx512vl(auVar45,auVar46,1);
              bVar5 = (bool)((byte)uVar17 & 1);
              iVar24 = auVar46._0_4_;
              auVar47._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar27._0_4_;
              bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
              iVar54 = auVar46._4_4_;
              auVar47._4_4_ = (uint)bVar5 * iVar54 | (uint)!bVar5 * auVar27._4_4_;
              bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
              iVar55 = auVar46._8_4_;
              auVar47._8_4_ = (uint)bVar5 * iVar55 | (uint)!bVar5 * auVar27._8_4_;
              bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
              iVar56 = auVar46._12_4_;
              auVar47._12_4_ = (uint)bVar5 * iVar56 | (uint)!bVar5 * auVar27._12_4_;
              iVar57 = auVar46._16_4_;
              auVar47._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * iVar57;
              iVar58 = auVar46._20_4_;
              auVar47._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * iVar58;
              iVar59 = auVar46._24_4_;
              iVar60 = auVar46._28_4_;
              auVar47._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * iVar59;
              auVar47._28_4_ = (uint)(byte)(uVar17 >> 7) * iVar60;
              vandps_avx512vl(ZEXT1632(auVar25),auVar45);
              uVar17 = vcmpps_avx512vl(auVar47,auVar46,1);
              bVar5 = (bool)((byte)uVar17 & 1);
              auVar48._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar25._0_4_;
              bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar48._4_4_ = (uint)bVar5 * iVar54 | (uint)!bVar5 * auVar25._4_4_;
              bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar48._8_4_ = (uint)bVar5 * iVar55 | (uint)!bVar5 * auVar25._8_4_;
              bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar48._12_4_ = (uint)bVar5 * iVar56 | (uint)!bVar5 * auVar25._12_4_;
              auVar48._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * iVar57;
              auVar48._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * iVar58;
              auVar48._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * iVar59;
              auVar48._28_4_ = (uint)(byte)(uVar17 >> 7) * iVar60;
              vandps_avx512vl(ZEXT1632(auVar26),auVar45);
              uVar17 = vcmpps_avx512vl(auVar48,auVar46,1);
              bVar5 = (bool)((byte)uVar17 & 1);
              auVar49._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar26._0_4_;
              bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar49._4_4_ = (uint)bVar5 * iVar54 | (uint)!bVar5 * auVar26._4_4_;
              bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar49._8_4_ = (uint)bVar5 * iVar55 | (uint)!bVar5 * auVar26._8_4_;
              bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar49._12_4_ = (uint)bVar5 * iVar56 | (uint)!bVar5 * auVar26._12_4_;
              auVar49._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * iVar57;
              auVar49._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * iVar58;
              auVar49._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * iVar59;
              auVar49._28_4_ = (uint)(byte)(uVar17 >> 7) * iVar60;
              auVar45 = vrcp14ps_avx512vl(auVar47);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar50 = vfnmadd213ps_avx512vl(auVar47,auVar45,auVar46);
              auVar27 = vfmadd132ps_fma(auVar50,auVar45,auVar45);
              auVar45 = vrcp14ps_avx512vl(auVar48);
              auVar50 = vfnmadd213ps_avx512vl(auVar48,auVar45,auVar46);
              auVar25 = vfmadd132ps_fma(auVar50,auVar45,auVar45);
              auVar45 = vrcp14ps_avx512vl(auVar49);
              auVar46 = vfnmadd213ps_avx512vl(auVar49,auVar45,auVar46);
              auVar26 = vfmadd132ps_fma(auVar46,auVar45,auVar45);
              auVar51 = vfmadd213ps_avx512vl(auVar51,auVar32,*(undefined1 (*) [32])(uVar16 + 0x160))
              ;
              auVar45 = vfmadd231ps_avx512vl(auVar51,auVar31,*(undefined1 (*) [32])(uVar16 + 0xa0));
              auVar51 = vfmadd213ps_avx512vl(auVar52,auVar32,*(undefined1 (*) [32])(uVar16 + 0x180))
              ;
              auVar52 = vfmadd231ps_avx512vl(auVar51,auVar31,*(undefined1 (*) [32])(uVar16 + 0xc0));
              auVar51 = vfmadd213ps_avx512vl(auVar53,auVar32,*(undefined1 (*) [32])(uVar16 + 0x1a0))
              ;
              auVar53 = vfmadd231ps_avx512vl(auVar51,auVar31,auVar44);
              auVar51._4_4_ = fVar64 * *(float *)(uVar16 + 0x1c4);
              auVar51._0_4_ = fVar64 * *(float *)(uVar16 + 0x1c0);
              auVar51._8_4_ = fVar64 * *(float *)(uVar16 + 0x1c8);
              auVar51._12_4_ = fVar64 * *(float *)(uVar16 + 0x1cc);
              auVar51._16_4_ = fVar64 * *(float *)(uVar16 + 0x1d0);
              auVar51._20_4_ = fVar64 * *(float *)(uVar16 + 0x1d4);
              auVar51._24_4_ = fVar64 * *(float *)(uVar16 + 0x1d8);
              auVar51._28_4_ = auVar44._28_4_;
              auVar29 = vfmadd231ps_fma(auVar45,auVar87,auVar42);
              auVar44._4_4_ = fVar64 * *(float *)(uVar16 + 0x1e4);
              auVar44._0_4_ = fVar64 * *(float *)(uVar16 + 0x1e0);
              auVar44._8_4_ = fVar64 * *(float *)(uVar16 + 0x1e8);
              auVar44._12_4_ = fVar64 * *(float *)(uVar16 + 0x1ec);
              auVar44._16_4_ = fVar64 * *(float *)(uVar16 + 0x1f0);
              auVar44._20_4_ = fVar64 * *(float *)(uVar16 + 500);
              auVar44._24_4_ = fVar64 * *(float *)(uVar16 + 0x1f8);
              auVar44._28_4_ = auVar42._28_4_;
              auVar30 = vfmadd231ps_fma(auVar52,auVar87,auVar41);
              auVar52._4_4_ = fVar64 * *(float *)(uVar16 + 0x204);
              auVar52._0_4_ = fVar64 * *(float *)(uVar16 + 0x200);
              auVar52._8_4_ = fVar64 * *(float *)(uVar16 + 0x208);
              auVar52._12_4_ = fVar64 * *(float *)(uVar16 + 0x20c);
              auVar52._16_4_ = fVar64 * *(float *)(uVar16 + 0x210);
              auVar52._20_4_ = fVar64 * *(float *)(uVar16 + 0x214);
              auVar52._24_4_ = fVar64 * *(float *)(uVar16 + 0x218);
              auVar52._28_4_ = auVar41._28_4_;
              auVar28 = vfmadd231ps_fma(auVar51,auVar63,ZEXT832(0) << 0x20);
              auVar65 = vfmadd231ps_fma(auVar53,auVar87,auVar43);
              auVar66 = vfmadd231ps_fma(auVar44,auVar63,ZEXT832(0) << 0x20);
              auVar74._0_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x220);
              auVar74._4_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x224);
              auVar74._8_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x228);
              auVar74._12_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x22c);
              auVar74._16_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x230);
              auVar74._20_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x234);
              auVar74._24_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x238);
              auVar74._28_4_ = auVar63._0_4_ + auVar43._28_4_;
              auVar42 = vsubps_avx(ZEXT1632(auVar28),ZEXT1632(auVar29));
              auVar41 = vsubps_avx(auVar74,ZEXT1632(auVar29));
              auVar29 = vfmadd231ps_fma(auVar52,auVar63,ZEXT832(0) << 0x20);
              auVar75._0_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x240);
              auVar75._4_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x244);
              auVar75._8_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x248);
              auVar75._12_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x24c);
              auVar75._16_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x250);
              auVar75._20_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x254);
              auVar75._24_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 600);
              auVar75._28_4_ = auVar63._0_4_ + auVar74._28_4_;
              auVar43 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar30));
              auVar44 = vsubps_avx(auVar75,ZEXT1632(auVar30));
              auVar76._0_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x260);
              auVar76._4_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x264);
              auVar76._8_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x268);
              auVar76._12_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x26c);
              auVar76._16_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x270);
              auVar76._20_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x274);
              auVar76._24_4_ = auVar63._0_4_ + fVar64 * *(float *)(uVar16 + 0x278);
              auVar76._28_4_ = auVar63._0_4_ + auVar75._28_4_;
              auVar51 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar65));
              auVar52 = vsubps_avx(auVar76,ZEXT1632(auVar65));
              auVar53._4_4_ = auVar42._4_4_ * auVar27._4_4_;
              auVar53._0_4_ = auVar42._0_4_ * auVar27._0_4_;
              auVar53._8_4_ = auVar42._8_4_ * auVar27._8_4_;
              auVar53._12_4_ = auVar42._12_4_ * auVar27._12_4_;
              auVar53._16_4_ = auVar42._16_4_ * 0.0;
              auVar53._20_4_ = auVar42._20_4_ * 0.0;
              auVar53._24_4_ = auVar42._24_4_ * 0.0;
              auVar53._28_4_ = auVar76._28_4_;
              auVar46._4_4_ = auVar27._4_4_ * auVar41._4_4_;
              auVar46._0_4_ = auVar27._0_4_ * auVar41._0_4_;
              auVar46._8_4_ = auVar27._8_4_ * auVar41._8_4_;
              auVar46._12_4_ = auVar27._12_4_ * auVar41._12_4_;
              auVar46._16_4_ = auVar41._16_4_ * 0.0;
              auVar46._20_4_ = auVar41._20_4_ * 0.0;
              auVar46._24_4_ = auVar41._24_4_ * 0.0;
              auVar46._28_4_ = auVar41._28_4_;
              auVar77._0_4_ = auVar43._0_4_ * auVar25._0_4_;
              auVar77._4_4_ = auVar43._4_4_ * auVar25._4_4_;
              auVar77._8_4_ = auVar43._8_4_ * auVar25._8_4_;
              auVar77._12_4_ = auVar43._12_4_ * auVar25._12_4_;
              auVar77._16_4_ = auVar43._16_4_ * 0.0;
              auVar77._20_4_ = auVar43._20_4_ * 0.0;
              auVar77._24_4_ = auVar43._24_4_ * 0.0;
              auVar77._28_4_ = 0;
              auVar78 = ZEXT3264(auVar77);
              auVar50._4_4_ = auVar51._4_4_ * auVar26._4_4_;
              auVar50._0_4_ = auVar51._0_4_ * auVar26._0_4_;
              auVar50._8_4_ = auVar51._8_4_ * auVar26._8_4_;
              auVar50._12_4_ = auVar51._12_4_ * auVar26._12_4_;
              auVar50._16_4_ = auVar51._16_4_ * 0.0;
              auVar50._20_4_ = auVar51._20_4_ * 0.0;
              auVar50._24_4_ = auVar51._24_4_ * 0.0;
              auVar50._28_4_ = auVar51._28_4_;
              auVar10._4_4_ = auVar44._4_4_ * auVar25._4_4_;
              auVar10._0_4_ = auVar44._0_4_ * auVar25._0_4_;
              auVar10._8_4_ = auVar44._8_4_ * auVar25._8_4_;
              auVar10._12_4_ = auVar44._12_4_ * auVar25._12_4_;
              auVar10._16_4_ = auVar44._16_4_ * 0.0;
              auVar10._20_4_ = auVar44._20_4_ * 0.0;
              auVar10._24_4_ = auVar44._24_4_ * 0.0;
              auVar10._28_4_ = auVar44._28_4_;
              auVar11._4_4_ = auVar52._4_4_ * auVar26._4_4_;
              auVar11._0_4_ = auVar52._0_4_ * auVar26._0_4_;
              auVar11._8_4_ = auVar52._8_4_ * auVar26._8_4_;
              auVar11._12_4_ = auVar52._12_4_ * auVar26._12_4_;
              auVar11._16_4_ = auVar52._16_4_ * 0.0;
              auVar11._20_4_ = auVar52._20_4_ * 0.0;
              auVar11._24_4_ = auVar52._24_4_ * 0.0;
              auVar11._28_4_ = auVar52._28_4_;
              auVar42 = vpminsd_avx2(auVar77,auVar10);
              auVar41 = vpminsd_avx2(auVar50,auVar11);
              auVar42 = vmaxps_avx(auVar42,auVar41);
              auVar71 = ZEXT3264(auVar42);
              auVar51 = vpminsd_avx2(auVar53,auVar46);
              auVar43 = vpmaxsd_avx2(auVar53,auVar46);
              auVar41 = vpmaxsd_avx2(auVar77,auVar10);
              auVar44 = vpmaxsd_avx2(auVar50,auVar11);
              auVar41 = vminps_avx(auVar41,auVar44);
              auVar44 = vmaxps_avx512vl(auVar39,auVar51);
              auVar42 = vmaxps_avx(auVar44,auVar42);
              auVar43 = vminps_avx512vl(auVar40,auVar43);
              auVar41 = vminps_avx(auVar43,auVar41);
              auVar43._8_4_ = 0x3f7ffffa;
              auVar43._0_8_ = 0x3f7ffffa3f7ffffa;
              auVar43._12_4_ = 0x3f7ffffa;
              auVar43._16_4_ = 0x3f7ffffa;
              auVar43._20_4_ = 0x3f7ffffa;
              auVar43._24_4_ = 0x3f7ffffa;
              auVar43._28_4_ = 0x3f7ffffa;
              auVar43 = vmulps_avx512vl(auVar42,auVar43);
              auVar42._8_4_ = 0x3f800003;
              auVar42._0_8_ = 0x3f8000033f800003;
              auVar42._12_4_ = 0x3f800003;
              auVar42._16_4_ = 0x3f800003;
              auVar42._20_4_ = 0x3f800003;
              auVar42._24_4_ = 0x3f800003;
              auVar42._28_4_ = 0x3f800003;
              auVar42 = vmulps_avx512vl(auVar41,auVar42);
              uVar6 = vcmpps_avx512vl(auVar43,auVar42,2);
              uVar18 = (uint)uVar6;
            }
            else {
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar22),auVar62,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + uVar22));
              auVar42 = vsubps_avx(ZEXT1632(auVar27),auVar87);
              auVar41 = vmulps_avx512vl(auVar33,auVar42);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar23),auVar62,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + uVar23));
              auVar42 = vsubps_avx512vl(ZEXT1632(auVar27),auVar31);
              auVar42 = vmulps_avx512vl(auVar34,auVar42);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar21),auVar62,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + uVar21));
              auVar43 = vsubps_avx512vl(ZEXT1632(auVar27),auVar32);
              auVar43 = vmulps_avx512vl(auVar35,auVar43);
              auVar42 = vmaxps_avx(auVar42,auVar43);
              auVar41 = vmaxps_avx512vl(auVar39,auVar41);
              auVar42 = vmaxps_avx(auVar41,auVar42);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar22 ^ 0x20)),
                                        auVar62,*(undefined1 (*) [32])
                                                 (uVar16 + 0x40 + (uVar22 ^ 0x20)));
              auVar41 = vsubps_avx(ZEXT1632(auVar27),auVar87);
              auVar43 = vmulps_avx512vl(auVar36,auVar41);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar23 ^ 0x20)),
                                        auVar62,*(undefined1 (*) [32])
                                                 (uVar16 + 0x40 + (uVar23 ^ 0x20)));
              auVar41 = vsubps_avx512vl(ZEXT1632(auVar27),auVar31);
              auVar41 = vmulps_avx512vl(auVar37,auVar41);
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar21 ^ 0x20)),
                                        auVar62,*(undefined1 (*) [32])
                                                 (uVar16 + 0x40 + (uVar21 ^ 0x20)));
              auVar44 = vsubps_avx512vl(ZEXT1632(auVar27),auVar32);
              auVar44 = vmulps_avx512vl(auVar38,auVar44);
              auVar71 = ZEXT3264(auVar44);
              auVar41 = vminps_avx(auVar41,auVar44);
              auVar43 = vminps_avx512vl(auVar40,auVar43);
              auVar41 = vminps_avx(auVar43,auVar41);
              if (uVar18 == 6) {
                uVar6 = vcmpps_avx512vl(auVar42,auVar41,2);
                uVar7 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [32])(uVar16 + 0x1c0),0xd);
                uVar8 = vcmpps_avx512vl(auVar62,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
                uVar18 = (uint)uVar6 & (uint)uVar7 & (uint)uVar8;
              }
              else {
                uVar6 = vcmpps_avx512vl(auVar42,auVar41,2);
                uVar18 = (uint)uVar6;
              }
            }
            if ((byte)uVar18 == 0) goto LAB_01c56066;
            lVar9 = 0;
            for (uVar17 = (ulong)(byte)uVar18; (uVar17 & 1) == 0;
                uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            uVar17 = *(ulong *)(uVar16 + lVar9 * 8);
            uVar18 = (uVar18 & 0xff) - 1 & uVar18 & 0xff;
            uVar19 = (ulong)uVar18;
          } while (uVar18 == 0);
          do {
            *puVar20 = uVar17;
            puVar20 = puVar20 + 1;
            lVar9 = 0;
            for (uVar17 = uVar19; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar9 = lVar9 + 1;
            }
            uVar19 = uVar19 - 1 & uVar19;
            uVar17 = *(ulong *)(uVar16 + lVar9 * 8);
          } while (uVar19 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }